

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_buf.c
# Opt level: O0

void yajl_buf_append(yajl_buf buf,void *data,size_t len)

{
  size_t in_RDX;
  yajl_buf in_RSI;
  long in_RDI;
  
  yajl_buf_ensure_available(in_RSI,in_RDX);
  if (in_RDX != 0) {
    memcpy((void *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 8)),in_RSI,in_RDX);
    *(size_t *)(in_RDI + 8) = in_RDX + *(long *)(in_RDI + 8);
    *(undefined1 *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 8)) = 0;
  }
  return;
}

Assistant:

void yajl_buf_append(yajl_buf buf, const void * data, size_t len)
{
    yajl_buf_ensure_available(buf, len);
    if (len > 0) {
        assert(data != NULL);
        memcpy(buf->data + buf->used, data, len);
        buf->used += len;
        buf->data[buf->used] = 0;
    }
}